

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O0

bool all_tensors_in_other(gguf_context *ctx,gguf_context *other)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  char *__s;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  undefined8 in_RSI;
  undefined8 in_RDI;
  size_t offset;
  ggml_type type;
  int idx_other;
  string name;
  int id;
  int n_tensors;
  bool ok;
  allocator<char> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_41 [37];
  int local_1c;
  int local_18;
  byte local_11;
  undefined8 local_10;
  undefined8 local_8;
  
  local_11 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = gguf_get_n_tensors(in_RDI);
  for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
    __s = (char *)gguf_get_tensor_name(local_8,(long)local_1c);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,__s,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)local_41);
    uVar1 = local_10;
    uVar4 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff80 = (allocator<char> *)gguf_find_tensor(uVar1,uVar4);
    if ((local_1c == (int)in_stack_ffffffffffffff80) ||
       (local_11 = 0, -1 < (int)in_stack_ffffffffffffff80)) {
      iVar2 = gguf_get_tensor_type(local_8,(long)local_1c);
      iVar3 = gguf_get_tensor_type(local_10,(long)local_1c);
      if (iVar2 != iVar3) {
        local_11 = 0;
      }
      lVar5 = gguf_get_tensor_offset(local_8,(long)local_1c);
      lVar6 = gguf_get_tensor_offset(local_10,(long)local_1c);
      if (lVar5 != lVar6) {
        local_11 = 0;
      }
    }
    std::__cxx11::string::~string((string *)(local_41 + 1));
  }
  return (bool)(local_11 & 1);
}

Assistant:

static bool all_tensors_in_other(const gguf_context * ctx, const gguf_context * other) {
    bool ok = true;

    const int n_tensors = gguf_get_n_tensors(ctx);
    for (int id = 0; id < n_tensors; ++id) {
        const std::string name = gguf_get_tensor_name(ctx, id);

        const int idx_other = gguf_find_tensor(other, name.c_str());
        if (id != idx_other) {
            ok = false;
            if (idx_other < 0) {
                continue;
            }
        }

        const ggml_type type = gguf_get_tensor_type(ctx, id);
        if (type != gguf_get_tensor_type(other, id)) {
            ok = false;
        }

        const size_t offset = gguf_get_tensor_offset(ctx, id);
        if (offset != gguf_get_tensor_offset(other, id)) {
            ok = false;
        }
    }

    return ok;
}